

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *name,bool cap_first_letter)

{
  ulong uVar1;
  char *pcVar2;
  int local_20;
  byte local_19;
  int i;
  bool cap_first_letter_local;
  string *name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_19 = cap_first_letter;
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar1;
      local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), 'z' < *pcVar2)) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      if ((*pcVar2 < 'A') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), 'Z' < *pcVar2)) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
        if (('/' < *pcVar2) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar2 < ':')) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
        local_19 = 1;
      }
      else {
        if ((local_20 == 0) && ((local_19 & 1) == 0)) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2 + ' ');
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
        }
        local_19 = 0;
      }
    }
    else {
      if ((local_19 & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2 + -0x20);
      }
      local_19 = 0;
    }
  }
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
  if (*pcVar2 == '#') {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(const std::string& name,
                                   bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}